

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O1

void duckdb::StringStats::Verify
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  UnicodeType UVar4;
  ulong uVar5;
  InternalException *pIVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint *s;
  bool bVar10;
  string_t value;
  UnifiedVectorFormat vdata;
  string local_1d8;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  data_ptr_t local_1a0;
  UnifiedVectorFormat local_198;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_198);
  Vector::ToUnifiedFormat(vector,count,&local_198);
  if (count != 0) {
    local_1a0 = local_198.data;
    uVar9 = 0;
    do {
      uVar7 = uVar9;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)sel->sel_vector[uVar9];
      }
      if ((local_198.sel)->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)(local_198.sel)->sel_vector[uVar7];
      }
      if ((local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6]
           >> (uVar7 & 0x3f) & 1) != 0)) {
        puVar1 = (uint *)(local_1a0 + uVar7 * 0x10);
        uVar3 = *puVar1;
        uStack_1b4 = puVar1[1];
        uStack_1b0 = puVar1[2];
        uStack_1ac = puVar1[3];
        uVar7 = (ulong)uVar3;
        s = &uStack_1b4;
        if (0xc < uVar7) {
          s = *(uint **)(puVar1 + 2);
        }
        local_1b8 = uVar3;
        if (((stats->stats_union).string_data.has_max_string_length == true) &&
           ((stats->stats_union).string_data.max_string_length < uVar3)) {
          pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d8,
                     "Statistics mismatch: string value exceeds maximum string length.\nStatistics: %s\nVector: %s"
                     ,"");
          BaseStatistics::ToString_abi_cxx11_(&local_50,stats);
          Vector::ToString_abi_cxx11_(&local_70,vector,count);
          InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                    (pIVar6,&local_1d8,&local_50,&local_70);
          __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (((stats->type).id_ == VARCHAR) &&
           ((stats->stats_union).string_data.has_unicode == false)) {
          UVar4 = Utf8Proc::Analyze((char *)s,uVar7,(UnicodeInvalidReason *)0x0,(size_t *)0x0);
          if (UVar4 == INVALID) {
            pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d8,"Invalid unicode detected in vector: %s","");
            Vector::ToString_abi_cxx11_(&local_d0,vector,count);
            InternalException::InternalException<std::__cxx11::string>(pIVar6,&local_1d8,&local_d0);
            __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (UVar4 == UNICODE) {
            pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d8,
                       "Statistics mismatch: string value contains unicode, but statistics says it shouldn\'t.\nStatistics: %s\nVector: %s"
                       ,"");
            BaseStatistics::ToString_abi_cxx11_(&local_90,stats);
            Vector::ToString_abi_cxx11_(&local_b0,vector,count);
            InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                      (pIVar6,&local_1d8,&local_90,&local_b0);
            __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        uVar5 = 8;
        if (uVar7 < 8) {
          uVar5 = uVar7;
        }
        if (uVar7 != 0) {
          lVar8 = 0;
          do {
            bVar2 = *(byte *)((long)&stats->stats_union + lVar8);
            if (*(byte *)((long)s + lVar8) < bVar2) {
              pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,
                         "Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s"
                         ,"");
              BaseStatistics::ToString_abi_cxx11_(&local_f0,stats);
              Vector::ToString_abi_cxx11_(&local_110,vector,count);
              InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                        (pIVar6,&local_1d8,&local_f0,&local_110);
              __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
            }
          } while ((*(byte *)((long)s + lVar8) <= bVar2) &&
                  (bVar10 = uVar5 - 1 != lVar8, lVar8 = lVar8 + 1, bVar10));
          if (uVar3 != 0) {
            uVar7 = 0;
            do {
              bVar2 = *(byte *)((long)&stats->stats_union + uVar7 + 8);
              if (*(byte *)((long)s + uVar7) < bVar2) break;
              if (bVar2 < *(byte *)((long)s + uVar7)) {
                pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d8,
                           "Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s"
                           ,"");
                BaseStatistics::ToString_abi_cxx11_(&local_130,stats);
                Vector::ToString_abi_cxx11_(&local_150,vector,count);
                InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                          (pIVar6,&local_1d8,&local_130,&local_150);
                __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error
                           );
              }
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != count);
  }
  if (local_198.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void StringStats::Verify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel, idx_t count) {
	auto &string_data = StringStats::GetDataUnsafe(stats);

	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		if (!vdata.validity.RowIsValid(index)) {
			continue;
		}
		auto value = data[index];
		auto data = value.GetData();
		auto len = value.GetSize();
		// LCOV_EXCL_START
		if (string_data.has_max_string_length && len > string_data.max_string_length) {
			throw InternalException(
			    "Statistics mismatch: string value exceeds maximum string length.\nStatistics: %s\nVector: %s",
			    stats.ToString(), vector.ToString(count));
		}
		if (stats.GetType().id() == LogicalTypeId::VARCHAR && !string_data.has_unicode) {
			auto unicode = Utf8Proc::Analyze(data, len);
			if (unicode == UnicodeType::UNICODE) {
				throw InternalException("Statistics mismatch: string value contains unicode, but statistics says it "
				                        "shouldn't.\nStatistics: %s\nVector: %s",
				                        stats.ToString(), vector.ToString(count));
			} else if (unicode == UnicodeType::INVALID) {
				throw InternalException("Invalid unicode detected in vector: %s", vector.ToString(count));
			}
		}
		if (StringValueComparison(const_data_ptr_cast(data),
		                          MinValue<idx_t>(len, StringStatsData::MAX_STRING_MINMAX_SIZE), string_data.min) < 0) {
			throw InternalException("Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		}
		if (StringValueComparison(const_data_ptr_cast(data),
		                          MinValue<idx_t>(len, StringStatsData::MAX_STRING_MINMAX_SIZE), string_data.max) > 0) {
			throw InternalException("Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		}
		// LCOV_EXCL_STOP
	}
}